

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void PathBezierQuadraticCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float tess_tol,int level)

{
  int iVar1;
  float y3_00;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  
  while( true ) {
    fVar2 = x3 - x1;
    fVar3 = y3 - y1;
    fVar4 = (x2 - x3) * fVar3 - fVar2 * (y2 - y3);
    if (fVar4 * fVar4 * 4.0 < (fVar2 * fVar2 + fVar3 * fVar3) * tess_tol) {
      iVar1 = path->Capacity;
      if (path->Size == iVar1) {
        iVar7 = path->Size + 1;
        if (iVar1 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar1 / 2 + iVar1;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        if (iVar1 < iVar7) {
          pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
          if (path->Data != (ImVec2 *)0x0) {
            memcpy(pIVar5,path->Data,(long)path->Size << 3);
            ImGui::MemFree(path->Data);
          }
          path->Data = pIVar5;
          path->Capacity = iVar7;
        }
      }
      pIVar5 = path->Data;
      iVar1 = path->Size;
      pIVar5[iVar1].x = x3;
      pIVar5[iVar1].y = y3;
      path->Size = path->Size + 1;
      return;
    }
    if (9 < level) break;
    fVar2 = (x2 + x1) * 0.5;
    fVar3 = (y2 + y1) * 0.5;
    x2 = (x2 + x3) * 0.5;
    y2 = (y2 + y3) * 0.5;
    fVar4 = (x2 + fVar2) * 0.5;
    y3_00 = (y2 + fVar3) * 0.5;
    level = level + 1;
    PathBezierQuadraticCurveToCasteljau(path,x1,y1,fVar2,fVar3,fVar4,y3_00,tess_tol,level);
    x1 = fVar4;
    y1 = y3_00;
  }
  return;
}

Assistant:

static void PathBezierQuadraticCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float tess_tol, int level)
{
    float dx = x3 - x1, dy = y3 - y1;
    float det = (x2 - x3) * dy - (y2 - y3) * dx;
    if (det * det * 4.0f < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x3, y3));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        PathBezierQuadraticCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, tess_tol, level + 1);
        PathBezierQuadraticCurveToCasteljau(path, x123, y123, x23, y23, x3, y3, tess_tol, level + 1);
    }
}